

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

Rect __thiscall nite::Rect::operator+(Rect *this,float c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *in_RDI;
  undefined4 in_XMM0_Db;
  Rect RVar4;
  
  RVar4.y = (float)in_XMM0_Db;
  RVar4.x = c;
  fVar1 = this->x;
  *in_RDI = fVar1;
  fVar2 = this->y;
  in_RDI[1] = fVar2;
  fVar3 = this->w;
  in_RDI[2] = fVar3;
  RVar4.w = fVar1 + c;
  fVar1 = this->h;
  *in_RDI = RVar4.w;
  in_RDI[1] = fVar2 + c;
  in_RDI[2] = fVar3 + c;
  in_RDI[3] = fVar1 + c;
  RVar4.h = 0.0;
  return RVar4;
}

Assistant:

nite::Rect nite::Rect::operator+(float c){
	Rect R = *this;
	R.x += c;
	R.y += c;
	R.w += c;
	R.h += c;
	return R;
}